

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch_s.c
# Opt level: O3

void * bsearch_s(void *key,void *base,rsize_t nmemb,rsize_t size,
                _func_int_void_ptr_void_ptr_void_ptr *compar,void *context)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  
  if (-1 < (long)(size | nmemb)) {
    if (nmemb == 0) {
      return (void *)0x0;
    }
    if (compar != (_func_int_void_ptr_void_ptr_void_ptr *)0x0 &&
        (base != (void *)0x0 && key != (void *)0x0)) {
      do {
        uVar2 = nmemb >> 1;
        pvVar3 = (void *)(uVar2 * size + (long)base);
        iVar1 = (*compar)(key,pvVar3,context);
        if (iVar1 < 1) {
          if (iVar1 == 0) {
            return pvVar3;
          }
        }
        else {
          base = (void *)((long)pvVar3 + size);
          uVar2 = uVar2 - (~(uint)nmemb & 1);
        }
        nmemb = uVar2;
      } while (uVar2 != 0);
      return (void *)0x0;
    }
  }
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  return (void *)0x0;
}

Assistant:

void * bsearch_s( const void * key, const void * base, rsize_t nmemb, rsize_t size, int ( *compar )( const void *, const void *, void * ), void * context )
{
    const void * pivot;
    int rc;
    size_t corr;

    if ( nmemb > RSIZE_MAX || size > RSIZE_MAX || ( nmemb > 0 && ( key == NULL || base == NULL || compar == NULL ) ) )
    {
        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return NULL;
    }

    while ( nmemb )
    {
        /* algorithm needs -1 correction if remaining elements are an even number. */
        corr = nmemb % 2;
        nmemb /= 2;
        pivot = ( const char * )base + ( nmemb * size );
        rc = compar( key, pivot, context );

        if ( rc > 0 )
        {
            base = ( const char * )pivot + size;
            /* applying correction */
            nmemb -= ( 1 - corr );
        }
        else if ( rc == 0 )
        {
            return ( void * )pivot;
        }
    }

    return NULL;
}